

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OplsTorsionType.hpp
# Opt level: O3

ostream * OpenMD::operator<<(ostream *os,OplsTorsionType *ott)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"This OplsTorsionType has below form:",0x24)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>(ott->v1_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/2*(1+cos(phi))",0xf);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," + ",3);
  poVar1 = std::ostream::_M_insert<double>(ott->v2_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/2*(1-cos(2*phi))",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," + ",3);
  poVar1 = std::ostream::_M_insert<double>(ott->v3_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/2*(1+cos(3*phi))",0x11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, OplsTorsionType& ott) {
    os << "This OplsTorsionType has below form:" << std::endl;
    os << ott.v1_ << "/2*(1+cos(phi))"
       << " + " << ott.v2_ << "/2*(1-cos(2*phi))"
       << " + " << ott.v3_ << "/2*(1+cos(3*phi))" << std::endl;
    return os;
  }